

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O2

int pg::ceil_log2(unsigned_long_long x)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar1 = (uint)((x - 1 & x) != 0);
  uVar2 = 0x20;
  for (lVar3 = 0; lVar3 != 0x30; lVar3 = lVar3 + 8) {
    uVar4 = 0;
    if ((*(ulong *)((long)ceil_log2::t + lVar3) & x) != 0) {
      uVar4 = uVar2;
    }
    uVar1 = uVar1 + (int)uVar4;
    x = x >> uVar4;
    uVar2 = uVar2 >> 1;
  }
  return uVar1;
}

Assistant:

static int
ceil_log2(unsigned long long x)
{
    static const unsigned long long t[6] = {
        0xFFFFFFFF00000000ull,
        0x00000000FFFF0000ull,
        0x000000000000FF00ull,
        0x00000000000000F0ull,
        0x000000000000000Cull,
        0x0000000000000002ull
    };

    int y = (((x & (x - 1)) == 0) ? 0 : 1);
    int j = 32;
    int i;

    for (i = 0; i < 6; i++) {
        int k = (((x & t[i]) == 0) ? 0 : j);
        y += k;
        x >>= k;
        j >>= 1;
    }

    return y;
}